

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::Args(Args *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x40);
  std::__cxx11::string::string(in_RDI + 0x60);
  std::__cxx11::string::string(in_RDI + 0x80);
  std::__cxx11::string::string(in_RDI + 0xa0);
  std::__cxx11::string::string(in_RDI + 0xc0);
  std::__cxx11::string::string(in_RDI + 0xe0);
  std::__cxx11::string::string(in_RDI + 0x148);
  std::__cxx11::string::string(in_RDI + 0x170);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x133e1f);
  *(undefined8 *)(in_RDI + 0x100) = 0x3fa999999999999a;
  *(undefined4 *)(in_RDI + 0x10c) = 100;
  *(undefined4 *)(in_RDI + 0x110) = 5;
  *(undefined4 *)(in_RDI + 0x114) = 5;
  *(undefined4 *)(in_RDI + 0x118) = 5;
  *(undefined4 *)(in_RDI + 0x11c) = 5;
  *(undefined4 *)(in_RDI + 0x128) = 1;
  *(undefined4 *)(in_RDI + 300) = 2;
  *(undefined4 *)(in_RDI + 0x130) = 2;
  *(undefined4 *)(in_RDI + 0x134) = 2000000;
  *(undefined4 *)(in_RDI + 0x138) = 0xc;
  *(undefined4 *)(in_RDI + 0x108) = 100;
  *(undefined8 *)(in_RDI + 0x140) = 0x3f1a36e2eb1c432d;
  std::__cxx11::string::operator=(in_RDI + 0x148,"__label__");
  *(undefined4 *)(in_RDI + 0x168) = 2;
  *(undefined4 *)(in_RDI + 0x120) = 3;
  *(undefined4 *)(in_RDI + 0x124) = 6;
  std::__cxx11::string::operator=(in_RDI + 0x170,"");
  return;
}

Assistant:

Args::Args() {
  lr = 0.05;
  dim = 100;
  ws = 5;
  epoch = 5;
  minCount = 5;
  neg = 5;
  wordNgrams = 1;
  loss = loss_name::ns;
  model = model_name::sg;
  bucket = 2000000;
  thread = 12;
  lrUpdateRate = 100;
  t = 1e-4;
  label = "__label__";
  verbose = 2;
  minn = 3;
  maxn = 6;
  pretrainedVectors = "";
}